

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall enact::VariableTypename::VariableTypename(VariableTypename *this,Token *identifier)

{
  Token *identifier_local;
  VariableTypename *this_local;
  
  Typename::Typename(&this->super_Typename);
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__VariableTypename_0016a910;
  Token::Token(&this->m_identifier,identifier);
  std::operator+(&this->m_name,"$",&(this->m_identifier).lexeme);
  return;
}

Assistant:

VariableTypename::VariableTypename(Token identifier) :
            m_identifier{std::move(identifier)},
            m_name{"$" + m_identifier.lexeme} {
    }